

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::internal::GeneratedMessageReflection::FindKnownExtensionByName
          (GeneratedMessageReflection *this,string *name)

{
  FieldDescriptor *extension;
  FieldDescriptor *pFVar1;
  Descriptor *pDVar2;
  long lVar3;
  
  if (this->extensions_offset_ == -1) {
    return (FieldDescriptor *)0x0;
  }
  pFVar1 = DescriptorPool::FindExtensionByName(this->descriptor_pool_,name);
  if (pFVar1 == (FieldDescriptor *)0x0) {
    pDVar2 = this->descriptor_;
  }
  else {
    pDVar2 = this->descriptor_;
    if (*(Descriptor **)(pFVar1 + 0x38) == pDVar2) {
      return pFVar1;
    }
  }
  if (((*(char *)(*(long *)(pDVar2 + 0x20) + 0x58) == '\x01') &&
      (pDVar2 = DescriptorPool::FindMessageTypeByName(this->descriptor_pool_,name),
      pDVar2 != (Descriptor *)0x0)) && (lVar3 = (long)*(int *)(pDVar2 + 0x68), 0 < lVar3)) {
    pFVar1 = *(FieldDescriptor **)(pDVar2 + 0x70);
    do {
      if (((*(Descriptor **)(pFVar1 + 0x38) == this->descriptor_) &&
          (*(int *)(pFVar1 + 0x2c) == 0xb)) &&
         ((*(int *)(pFVar1 + 0x30) == 1 && (*(Descriptor **)(pFVar1 + 0x48) == pDVar2)))) {
        return pFVar1;
      }
      pFVar1 = pFVar1 + 0x78;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return (FieldDescriptor *)0x0;
}

Assistant:

const FieldDescriptor* GeneratedMessageReflection::FindKnownExtensionByName(
    const string& name) const {
  if (extensions_offset_ == -1) return NULL;

  const FieldDescriptor* result = descriptor_pool_->FindExtensionByName(name);
  if (result != NULL && result->containing_type() == descriptor_) {
    return result;
  }

  if (descriptor_->options().message_set_wire_format()) {
    // MessageSet extensions may be identified by type name.
    const Descriptor* type = descriptor_pool_->FindMessageTypeByName(name);
    if (type != NULL) {
      // Look for a matching extension in the foreign type's scope.
      for (int i = 0; i < type->extension_count(); i++) {
        const FieldDescriptor* extension = type->extension(i);
        if (extension->containing_type() == descriptor_ &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() &&
            extension->message_type() == type) {
          // Found it.
          return extension;
        }
      }
    }
  }

  return NULL;
}